

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

void __thiscall gl4cts::CopyImage::FunctionalTest::clean(FunctionalTest *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  FunctionalTest *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x480))(1,&this->m_dst_tex_name);
  (**(code **)(lVar3 + 0x480))(1,&this->m_src_tex_name);
  this->m_dst_tex_name = 0;
  this->m_src_tex_name = 0;
  if (this->m_dst_buf_name != 0) {
    (**(code **)(lVar3 + 0x438))(1,&this->m_dst_buf_name);
    this->m_dst_buf_name = 0;
  }
  if (this->m_rb_name != 0) {
    (**(code **)(lVar3 + 0x460))(1,&this->m_rb_name);
    this->m_rb_name = 0;
  }
  if (this->m_src_buf_name != 0) {
    (**(code **)(lVar3 + 0x438))(1,&this->m_src_buf_name);
    this->m_src_buf_name = 0;
  }
  return;
}

Assistant:

void FunctionalTest::clean()
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

	/* Clean textures and buffers. Errors ignored */
	gl.deleteTextures(1, &m_dst_tex_name);
	gl.deleteTextures(1, &m_src_tex_name);

	m_dst_tex_name = 0;
	m_src_tex_name = 0;

	if (0 != m_dst_buf_name)
	{
		gl.deleteBuffers(1, &m_dst_buf_name);
		m_dst_buf_name = 0;
	}

	if (0 != m_rb_name)
	{
		gl.deleteRenderbuffers(1, &m_rb_name);
		m_rb_name = 0;
	}

	if (0 != m_src_buf_name)
	{
		gl.deleteBuffers(1, &m_src_buf_name);
		m_src_buf_name = 0;
	}
}